

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_shooting_cgmres.cpp
# Opt level: O2

void __thiscall
MultipleShootingCGMRES::initSolution
          (MultipleShootingCGMRES *this,double initial_time,VectorXd *initial_state_vec,
          VectorXd *initial_guess_input_vec,double convergence_radius,int max_iteration)

{
  int *x;
  double *__ptr;
  Index IVar1;
  int i_1;
  int iVar2;
  int i;
  long i_00;
  VectorXd initial_control_input_and_constraints_vec;
  VectorXd initial_lambda_vec;
  VectorXd initial_control_input_and_constraints_error;
  InitCGMRES initializer;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_200;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1f0;
  int *local_1e0;
  double local_1d8;
  Matrix<double,__1,_1,_0,__1,_1> local_1d0;
  undefined1 local_1c0 [56];
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_188;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_170;
  InitCGMRES local_158;
  
  x = &this->dim_control_input_and_constraints_;
  local_1d8 = convergence_radius;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_200,x);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_1d0,x);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1f0,&this->dim_state_);
  InitCGMRES::InitCGMRES(&local_158,this->model_,this->difference_increment_,this->dim_krylov_);
  this->initial_time_ = initial_time;
  local_1e0 = &this->dim_state_;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_170,&local_200
             ,(type *)0x0);
  InitCGMRES::solve0stepNOCP
            (&local_158,initial_time,initial_state_vec,initial_guess_input_vec,local_1d8,
             max_iteration,&local_170);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_188,&local_1f0
             ,(type *)0x0);
  NMPCModel::phixFunc(&this->model_,initial_time,initial_state_vec,&local_188);
  for (i_00 = 0; i_00 < this->horizon_division_num_; i_00 = i_00 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)local_1c0,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &this->control_input_and_constraints_seq_,(long)((int)i_00 * *x),*x);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_1c0,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_200);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1c0,
               &this->state_mat_,i_00);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1c0,
               initial_state_vec);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1c0,
               &this->lambda_mat_,i_00);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1c0,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_1f0);
  }
  InitCGMRES::getOptimalityErrorVec
            ((InitCGMRES *)local_1c0,initial_time,(VectorXd *)&local_158,initial_state_vec);
  IVar1 = local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  __ptr = local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_1c0._0_8_;
  local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_1c0._8_8_;
  local_1c0._0_8_ = __ptr;
  local_1c0._8_8_ = IVar1;
  free(__ptr);
  for (iVar2 = 0; iVar2 < this->horizon_division_num_; iVar2 = iVar2 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)local_1c0,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &this->control_input_and_constraints_error_seq_,(long)(*x * iVar2),*x);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_1c0,&local_1d0);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)local_1c0,(long)*local_1e0,(long)this->horizon_division_num_);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->state_error_mat_,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_1c0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)local_1c0,(long)this->dim_state_,
             (long)this->horizon_division_num_);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->lambda_error_mat_,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_1c0);
  InitCGMRES::~InitCGMRES(&local_158);
  free(local_1f0.m_storage.m_data);
  free(local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_200.m_storage.m_data);
  return;
}

Assistant:

void MultipleShootingCGMRES::initSolution(const double initial_time, const Eigen::VectorXd& initial_state_vec, const Eigen::VectorXd& initial_guess_input_vec, const double convergence_radius, const int max_iteration)
{
    Eigen::VectorXd initial_control_input_and_constraints_vec(dim_control_input_and_constraints_), initial_control_input_and_constraints_error(dim_control_input_and_constraints_), initial_lambda_vec(dim_state_);
    InitCGMRES initializer(model_, difference_increment_, dim_krylov_);
    initial_time_ = initial_time;

    // Intialize the solution
    initializer.solve0stepNOCP(initial_time, initial_state_vec, initial_guess_input_vec, convergence_radius, max_iteration, initial_control_input_and_constraints_vec);
    model_.phixFunc(initial_time, initial_state_vec, initial_lambda_vec);
    for(int i=0; i<horizon_division_num_; i++){
        control_input_and_constraints_seq_.segment(i*dim_control_input_and_constraints_, dim_control_input_and_constraints_) = initial_control_input_and_constraints_vec;
        state_mat_.col(i) = initial_state_vec;
        lambda_mat_.col(i) = initial_lambda_vec;
    }

    // Intialize the optimality error.
    initial_control_input_and_constraints_error = initializer.getOptimalityErrorVec(initial_time, initial_state_vec, initial_control_input_and_constraints_vec);
    for(int i=0; i<horizon_division_num_; i++){
        control_input_and_constraints_error_seq_.segment(i*dim_control_input_and_constraints_, dim_control_input_and_constraints_) = initial_control_input_and_constraints_error;
    }
    state_error_mat_ = Eigen::MatrixXd::Zero(dim_state_, horizon_division_num_);
    lambda_error_mat_ = Eigen::MatrixXd::Zero(dim_state_, horizon_division_num_);
}